

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zello_log.h
# Opt level: O1

string * to_string_abi_cxx11_(string *__return_storage_ptr__,ze_image_flag_t flag)

{
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  if ((flag & ZE_IMAGE_FLAG_KERNEL_WRITE) != 0) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  if ((flag & ZE_IMAGE_FLAG_BIAS_UNCACHED) != 0) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string to_string(const ze_image_flag_t flag) {
  std::string flags = "";
  if (flag & ZE_IMAGE_FLAG_KERNEL_WRITE) {
    flags.append("|ZE_IMAGE_FLAG_KERNEL_WRITE|");
  }
  if (flag & ZE_IMAGE_FLAG_BIAS_UNCACHED) {
    flags.append("|ZE_IMAGE_FLAG_BIAS_UNCACHED|");
  }

  return flags;
}